

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O1

Gia_Man_t * Gia_ManAigSyn3(Gia_Man_t *p,int fVerbose,int fVeryVerbose)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  Jf_Par_t Pars;
  Jf_Par_t local_120;
  
  Jf_ManSetDefaultPars(&local_120);
  local_120.nRelaxRatio = 0x28;
  if (fVerbose != 0) {
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  }
  if (p->nObjs == p->vCis->nSize + p->vCos->nSize + 1) {
    pGVar1 = Gia_ManDup(p);
  }
  else {
    pGVar2 = Gia_ManAreaBalance(p,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    local_120.nLutSize = 6;
    pGVar2 = Jf_ManPerformMapping(pGVar2,&local_120);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    pGVar1 = Gia_ManAreaBalance(pGVar2,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(pGVar2);
    local_120.nLutSize = 4;
    pGVar2 = Jf_ManPerformMapping(pGVar1,&local_120);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    pGVar1 = Gia_ManAreaBalance(pGVar2,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(pGVar2);
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManAigSyn3( Gia_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Jf_Par_t Pars, * pPars = &Pars;
    Jf_ManSetDefaultPars( pPars );
    pPars->nRelaxRatio = 40;
    if ( fVerbose )     Gia_ManPrintStats( p, NULL );
    if ( Gia_ManAndNum(p) == 0 )
        return Gia_ManDup(p);
    // perform balancing
    pNew = Gia_ManAreaBalance( p, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    // perform mapping
    pPars->nLutSize = 6;
    pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
//    Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    // perform mapping
    pPars->nLutSize = 4;
    pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
//    Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    return pNew;
}